

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhMoveLocalCell(lhcell *pCell,sxu16 iOfft,void *pData,unqlite_int64 nData)

{
  sxu16 sVar1;
  uint nLen;
  lhpage *plVar2;
  int iVar3;
  lhcell *plVar4;
  uchar *pDest;
  
  sVar1 = pCell->iStart;
  plVar2 = pCell->pPage;
  plVar4 = plVar2->pMaster->pFirst;
  do {
    if (plVar4 == (lhcell *)0x0) {
      *(sxu16 *)plVar2->pRaw->zData = pCell->iNext << 8 | pCell->iNext >> 8;
      (plVar2->sHdr).iOfft = pCell->iNext;
LAB_0011528b:
      pCell->iStart = iOfft;
      pCell->nData = nData;
      nLen = pCell->nKey;
      pDest = pCell->pPage->pRaw->zData + (ulong)iOfft + 0x1a;
      SyMemcpy(plVar2->pRaw->zData + (ushort)(sVar1 + 0x1a),pDest,nLen);
      if (0 < nData) {
        SyMemcpy(pData,pDest + nLen,(sxu32)nData);
      }
      iVar3 = lhCellWriteHeader(pCell);
      return iVar3;
    }
    if ((plVar4->pPage == plVar2) && (plVar4->iNext == sVar1)) {
      *(sxu16 *)(plVar2->pRaw->zData + (ulong)plVar4->iStart + 0x10) =
           pCell->iNext << 8 | pCell->iNext >> 8;
      plVar4->iNext = pCell->iNext;
      goto LAB_0011528b;
    }
    plVar4 = plVar4->pPrev;
  } while( true );
}

Assistant:

static int lhMoveLocalCell(
	lhcell *pCell,
	sxu16 iOfft,
	const void *pData,
	unqlite_int64 nData
	)
{
	sxu16 iKeyOfft = pCell->iStart + L_HASH_CELL_SZ;
	lhpage *pPage = pCell->pPage;
	lhcell *pSibeling;
	pSibeling = lhFindSibeling(pCell);
	if( pSibeling ){
		/* Fix link */
		SyBigEndianPack16(&pPage->pRaw->zData[pSibeling->iStart + 4/*Hash*/+4/*Key*/+8/*Data*/],pCell->iNext);
		pSibeling->iNext = pCell->iNext;
	}else{
		/* First cell, update page header only */
		SyBigEndianPack16(pPage->pRaw->zData,pCell->iNext);
		pPage->sHdr.iOfft = pCell->iNext;
	}
	/* Set the new offset */
	pCell->iStart = iOfft;
	pCell->nData = (sxu64)nData;
	/* Write the cell payload */
	lhCellWriteLocalPayload(pCell,(const void *)&pPage->pRaw->zData[iKeyOfft],pCell->nKey,pData,nData);
	/* Finally write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}